

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.h
# Opt level: O0

void __thiscall kj::MainBuilder::Validity::~Validity(Validity *this)

{
  Validity *this_local;
  
  Maybe<kj::String>::~Maybe(&this->errorMessage);
  return;
}

Assistant:

inline Validity(bool valid) {
      if (!valid) errorMessage = heapString("invalid argument");
    }